

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

lzham_decompress_status_t
lzham::lzham_lib_decompress_memory
          (lzham_decompress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  uint32 uVar1;
  size_t *pOut_buf_size;
  void *in_RDI;
  uint32 *in_R9;
  uint32 adler32;
  lzham_decompress_status_t status;
  lzham_decompress_state_ptr pState;
  lzham_decompress_params params;
  lzham_bool in_stack_ffffffffffffff94;
  lzham_decompress_params *in_stack_ffffffffffffff98;
  lzham_uint8 *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  lzham_uint8 *in_stack_ffffffffffffffb0;
  lzham_decompress_state_ptr in_stack_ffffffffffffffb8;
  lzham_decompress_status_t local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  else {
    memcpy(&stack0xffffffffffffffa0,in_RDI,0x28);
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffac | 1;
    pOut_buf_size = (size_t *)lzham_lib_decompress_init(in_stack_ffffffffffffff98);
    if (pOut_buf_size == (size_t *)0x0) {
      local_4 = LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;
    }
    else {
      local_4 = lzham_lib_decompress
                          (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                           (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           in_stack_ffffffffffffffa0,pOut_buf_size,in_stack_ffffffffffffff94);
      uVar1 = lzham_lib_decompress_deinit(pOut_buf_size);
      if (in_R9 != (uint32 *)0x0) {
        *in_R9 = uVar1;
      }
    }
  }
  return local_4;
}

Assistant:

lzham_decompress_status_t LZHAM_CDECL lzham_lib_decompress_memory(const lzham_decompress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if (!pParams)
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;

      lzham_decompress_params params(*pParams);
      params.m_decompress_flags |= LZHAM_DECOMP_FLAG_OUTPUT_UNBUFFERED;

      lzham_decompress_state_ptr pState = lzham_lib_decompress_init(&params);
      if (!pState)
         return LZHAM_DECOMP_STATUS_FAILED_INITIALIZING;

      lzham_decompress_status_t status = lzham_lib_decompress(pState, pSrc_buf, &src_len, pDst_buf, pDst_len, true);

      uint32 adler32 = lzham_lib_decompress_deinit(pState);
      if (pAdler32)
         *pAdler32 = adler32;

      return status;
   }